

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O1

Float __thiscall pbrt::MIPMap::Bilerp<float>(MIPMap *this,int level,Point2f st)

{
  Image *this_00;
  Image *pIVar1;
  ulong uVar2;
  array<pbrt::WrapMode,_2> wrapMode;
  WrapMode2D wrapMode_00;
  size_t sVar3;
  int c;
  float fVar4;
  Float FVar5;
  undefined1 auVar6 [16];
  undefined1 in_ZMM1 [64];
  undefined1 local_38 [40];
  size_t local_10;
  
  auVar6 = in_ZMM1._0_16_;
  if ((level < 0) || (uVar2 = (ulong)(uint)level, (this->pyramid).nStored <= uVar2)) {
    LogFatal<char_const(&)[37]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
               ,0x188,"Check failed: %s",(char (*) [37])"level >= 0 && level < pyramid.size()");
  }
  pIVar1 = (this->pyramid).ptr;
  this_00 = pIVar1 + uVar2;
  local_38._0_4_ = (undefined4)pIVar1[uVar2].channelNames.nStored;
  if (local_38._0_4_ == 4) {
    wrapMode.values[1] = this->wrapMode;
    wrapMode.values[0] = this->wrapMode;
    c = 3;
  }
  else {
    if (local_38._0_4_ == 3) {
      wrapMode_00.wrap.values[1] = this->wrapMode;
      wrapMode_00.wrap.values[0] = this->wrapMode;
      Image::Bilerp((ImageChannelValues *)local_38,this_00,st,wrapMode_00);
      if (local_10 == 0) {
        fVar4 = 0.0;
      }
      else {
        if ((float *)local_38._8_8_ == (float *)0x0) {
          local_38._8_8_ = local_38 + 0x10;
        }
        fVar4 = 0.0;
        sVar3 = 0;
        do {
          fVar4 = fVar4 + *(float *)(local_38._8_8_ + sVar3 * 4);
          sVar3 = sVar3 + 1;
        } while (local_10 != sVar3);
      }
      auVar6 = vcvtusi2ss_avx512f(auVar6,local_10);
      InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)local_38);
      return fVar4 / auVar6._0_4_;
    }
    if (local_38._0_4_ != 1) {
      LogFatal<int>(Fatal,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
                    ,0x192,"Unexpected number of image channels: %d",(int *)local_38);
    }
    wrapMode.values[1] = this->wrapMode;
    wrapMode.values[0] = this->wrapMode;
    c = 0;
  }
  FVar5 = Image::BilerpChannel(this_00,st,c,(WrapMode2D)wrapMode.values);
  return FVar5;
}

Assistant:

Float MIPMap::Bilerp(int level, Point2f st) const {
    CHECK(level >= 0 && level < pyramid.size());
    switch (pyramid[level].NChannels()) {
    case 1:
        return pyramid[level].BilerpChannel(st, 0, wrapMode);
    case 3:
        return pyramid[level].Bilerp(st, wrapMode).Average();
    case 4:
        // Return alpha
        return pyramid[level].BilerpChannel(st, 3, wrapMode);
    default:
        LOG_FATAL("Unexpected number of image channels: %d", pyramid[level].NChannels());
    }
}